

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

void fp_abort_output(fitsfile *infptr,fitsfile *outfptr,int stat)

{
  int in_EDX;
  long in_RSI;
  fitsfile *in_RDI;
  char msg [513];
  int hdunum;
  int status;
  char *in_stack_fffffffffffffdd8;
  fitsfile *in_stack_fffffffffffffde0;
  fitsfile *in_stack_fffffffffffffde8;
  int *in_stack_fffffffffffffe00;
  fitsfile *in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe5c;
  FILE *in_stack_fffffffffffffe60;
  uint local_1c [3];
  long local_10;
  fitsfile *local_8;
  
  local_1c[1] = 0;
  local_1c[2] = in_EDX;
  local_10 = in_RSI;
  if (in_RDI == (fitsfile *)0x0) {
    snprintf(&stack0xfffffffffffffdd8,0x201,"Error: Unable to process input file\n");
    fp_msg((char *)0x106838);
  }
  else {
    local_8 = in_RDI;
    ffflnm(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(int *)0x1067a4);
    ffghdn(local_8,(int *)local_1c);
    ffclos(in_stack_fffffffffffffde8,&in_stack_fffffffffffffde0->HDUposition);
    snprintf(&stack0xfffffffffffffdd8,0x201,"Error processing file: %s\n",tempfilename);
    fp_msg((char *)0x1067f3);
    snprintf(&stack0xfffffffffffffdd8,0x201,"  in HDU number %d\n",(ulong)local_1c[0]);
    fp_msg((char *)0x106818);
  }
  ffrprt(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  if (local_10 != 0) {
    ffdelt(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    fp_msg((char *)0x10687a);
  }
  exit(local_1c[2]);
}

Assistant:

void fp_abort_output (fitsfile *infptr, fitsfile *outfptr, int stat)
{
	int status = 0, hdunum;
	char  msg[SZ_STR];

        if (infptr)
        {
	   fits_file_name(infptr, tempfilename, &status);
	   fits_get_hdu_num(infptr, &hdunum);

           fits_close_file (infptr, &status);

	   snprintf(msg, SZ_STR,"Error processing file: %s\n", tempfilename);
	   fp_msg (msg);
	   snprintf(msg, SZ_STR,"  in HDU number %d\n", hdunum);
	   fp_msg (msg);
        }
        else
        {
           snprintf(msg, SZ_STR,"Error: Unable to process input file\n");
           fp_msg(msg);
        }
	fits_report_error (stderr, stat);

	if (outfptr) {
	    fits_delete_file(outfptr, &status);
	    fp_msg ("Input file is unchanged.\n");
	}

	exit (stat); 
}